

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O2

Shader * __thiscall
deqp::gles31::Functional::ProgramInterfaceDefinition::Program::addShader
          (Program *this,ShaderType type,GLSLVersion version)

{
  Shader *shader;
  
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  ::reserve(&this->m_shaders,
            ((long)(this->m_shaders).
                   super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_shaders).
                   super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  shader = (Shader *)operator_new(0x38);
  shader->m_shaderType = type;
  shader->m_version = version;
  (shader->m_defaultBlock).variables.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (shader->m_defaultBlock).variables.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (shader->m_defaultBlock).variables.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (shader->m_defaultBlock).interfaceBlocks.
  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (shader->m_defaultBlock).interfaceBlocks.
  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (shader->m_defaultBlock).interfaceBlocks.
  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  ::push_back(&this->m_shaders,&shader);
  return shader;
}

Assistant:

Shader* Program::addShader (glu::ShaderType type, glu::GLSLVersion version)
{
	DE_ASSERT(type < glu::SHADERTYPE_LAST);

	Shader* shader;

	// make sure push_back() cannot throw
	m_shaders.reserve(m_shaders.size() + 1);

	shader = new Shader(type, version);
	m_shaders.push_back(shader);

	return shader;
}